

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDColor.cpp
# Opt level: O0

void __thiscall EDColor::validateEdgeSegments(EDColor *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  double *pdVar9;
  void *__s;
  size_type sVar10;
  reference pvVar11;
  int local_140;
  int i_4;
  int len;
  int i_3;
  int i_2;
  int i_1;
  int size;
  pointer piStack_120;
  pointer local_118;
  _InputArray local_108;
  allocator local_d9;
  string local_d8 [32];
  Mat local_b8 [8];
  Mat gradImage;
  int grad;
  int ch3Grad;
  int gyCh3;
  int gxCh3;
  int ch2Grad;
  int gyCh2;
  int gxCh2;
  int ch1Grad;
  int gyCh1;
  int gxCh1;
  int com2;
  int com1;
  int j;
  int i;
  int *grads;
  int maxGradValue;
  EDColor *this_local;
  
  uVar8 = SUB168(ZEXT816(0x8000) * ZEXT816(8),0);
  if (SUB168(ZEXT816(0x8000) * ZEXT816(8),8) != 0) {
    uVar8 = 0xffffffffffffffff;
  }
  pdVar9 = (double *)operator_new__(uVar8);
  this->H = pdVar9;
  memset(this->H,0,0x40000);
  memset(this->edgeImg,0,(long)(this->width * this->height));
  memset(this->gradImg,0,(long)this->width * 2 * (long)this->height);
  uVar8 = SUB168(ZEXT816(0x8000) * ZEXT816(4),0);
  if (SUB168(ZEXT816(0x8000) * ZEXT816(4),8) != 0) {
    uVar8 = 0xffffffffffffffff;
  }
  __s = operator_new__(uVar8);
  memset(__s,0,0x20000);
  for (com1 = 1; com1 < this->height + -1; com1 = com1 + 1) {
    for (com2 = 1; com2 < this->width + -1; com2 = com2 + 1) {
      iVar1 = (uint)this->smooth_L[(com1 + 1) * this->width + com2 + 1] -
              (uint)this->smooth_L[(com1 + -1) * this->width + com2 + -1];
      iVar2 = (uint)this->smooth_L[(com1 + -1) * this->width + com2 + 1] -
              (uint)this->smooth_L[(com1 + 1) * this->width + com2 + -1];
      iVar3 = iVar1 + iVar2 +
              ((uint)this->smooth_L[com1 * this->width + com2 + 1] -
              (uint)this->smooth_L[com1 * this->width + com2 + -1]);
      if (iVar3 < 1) {
        iVar3 = -iVar3;
      }
      iVar1 = (iVar1 - iVar2) +
              ((uint)this->smooth_L[(com1 + 1) * this->width + com2] -
              (uint)this->smooth_L[(com1 + -1) * this->width + com2]);
      if (iVar1 < 1) {
        iVar1 = -iVar1;
      }
      iVar4 = (uint)this->smooth_a[(com1 + 1) * this->width + com2 + 1] -
              (uint)this->smooth_a[(com1 + -1) * this->width + com2 + -1];
      iVar5 = (uint)this->smooth_a[(com1 + -1) * this->width + com2 + 1] -
              (uint)this->smooth_a[(com1 + 1) * this->width + com2 + -1];
      iVar2 = iVar4 + iVar5 +
              ((uint)this->smooth_a[com1 * this->width + com2 + 1] -
              (uint)this->smooth_a[com1 * this->width + com2 + -1]);
      if (iVar2 < 1) {
        iVar2 = -iVar2;
      }
      iVar4 = (iVar4 - iVar5) +
              ((uint)this->smooth_a[(com1 + 1) * this->width + com2] -
              (uint)this->smooth_a[(com1 + -1) * this->width + com2]);
      if (iVar4 < 1) {
        iVar4 = -iVar4;
      }
      iVar6 = (uint)this->smooth_b[(com1 + 1) * this->width + com2 + 1] -
              (uint)this->smooth_b[(com1 + -1) * this->width + com2 + -1];
      iVar7 = (uint)this->smooth_b[(com1 + -1) * this->width + com2 + 1] -
              (uint)this->smooth_b[(com1 + 1) * this->width + com2 + -1];
      iVar5 = iVar6 + iVar7 +
              ((uint)this->smooth_b[com1 * this->width + com2 + 1] -
              (uint)this->smooth_b[com1 * this->width + com2 + -1]);
      if (iVar5 < 1) {
        iVar5 = -iVar5;
      }
      iVar6 = (iVar6 - iVar7) +
              ((uint)this->smooth_b[(com1 + 1) * this->width + com2] -
              (uint)this->smooth_b[(com1 + -1) * this->width + com2]);
      if (iVar6 < 1) {
        iVar6 = -iVar6;
      }
      iVar3 = (iVar3 + iVar1 + iVar2 + iVar4 + iVar5 + iVar6 + 2) / 3;
      this->gradImg[com1 * this->width + com2] = (short)iVar3;
      *(int *)((long)__s + (long)iVar3 * 4) = *(int *)((long)__s + (long)iVar3 * 4) + 1;
    }
  }
  cv::Mat::Mat(local_b8,this->height,this->width,3,this->gradImg,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"newGrad.pgm",&local_d9);
  cv::_InputArray::_InputArray(&local_108,local_b8);
  _i_1 = (pointer)0x0;
  piStack_120 = (pointer)0x0;
  local_118 = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&i_1);
  cv::imwrite(local_d8,&local_108,(vector *)&i_1);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&i_1);
  cv::_InputArray::~_InputArray(&local_108);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  iVar3 = this->width;
  iVar1 = this->height;
  for (i_3 = 0x7fff; 0 < i_3; i_3 = i_3 + -1) {
    *(int *)((long)__s + (long)(i_3 + -1) * 4) =
         *(int *)((long)__s + (long)i_3 * 4) + *(int *)((long)__s + (long)(i_3 + -1) * 4);
  }
  for (len = 0; len < 0x8000; len = len + 1) {
    this->H[len] = (double)*(int *)((long)__s + (long)len * 4) /
                   (double)((iVar3 + -2) * (iVar1 + -2));
  }
  this->np = 0;
  i_4 = 0;
  while( true ) {
    sVar10 = std::
             vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
             ::size(&this->segments);
    if (sVar10 <= (ulong)(long)i_4) break;
    pvVar11 = std::
              vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
              ::operator[](&this->segments,(long)i_4);
    sVar10 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::size(pvVar11);
    this->np = ((int)sVar10 * ((int)sVar10 + -1)) / 2 + this->np;
    i_4 = i_4 + 1;
  }
  local_140 = 0;
  while( true ) {
    sVar10 = std::
             vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
             ::size(&this->segments);
    if (sVar10 <= (ulong)(long)local_140) break;
    pvVar11 = std::
              vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
              ::operator[](&this->segments,(long)local_140);
    sVar10 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::size(pvVar11);
    testSegment(this,local_140,0,(int)sVar10 + -1);
    local_140 = local_140 + 1;
  }
  if (this->H != (double *)0x0) {
    operator_delete__(this->H);
  }
  if (__s != (void *)0x0) {
    operator_delete__(__s);
  }
  cv::Mat::~Mat(local_b8);
  return;
}

Assistant:

void EDColor::validateEdgeSegments()
{
	int maxGradValue = MAX_GRAD_VALUE;
	H = new double[maxGradValue];
	memset(H, 0, sizeof(double)*maxGradValue);

	memset(edgeImg, 0, width*height); // clear edge image
	
	// Compute the gradient
	memset(gradImg, 0, sizeof(short)*width*height); // reset gradient Image pixels to zero

	int *grads = new int[maxGradValue];
	memset(grads, 0, sizeof(int)*maxGradValue);

	for (int i = 1; i<height - 1; i++) {
		for (int j = 1; j<width - 1; j++) {
			// Gradient for channel1
			int com1 = smooth_L[(i + 1)*width + j + 1] - smooth_L[(i - 1)*width + j - 1];
			int com2 = smooth_L[(i - 1)*width + j + 1] - smooth_L[(i + 1)*width + j - 1];

			int gxCh1 = abs(com1 + com2 + (smooth_L[i*width + j + 1] - smooth_L[i*width + j - 1]));
			int gyCh1 = abs(com1 - com2 + (smooth_L[(i + 1)*width + j] - smooth_L[(i - 1)*width + j]));
			int ch1Grad = gxCh1 + gyCh1;

			// Gradient for channel2
			com1 = smooth_a[(i + 1)*width + j + 1] - smooth_a[(i - 1)*width + j - 1];
			com2 = smooth_a[(i - 1)*width + j + 1] - smooth_a[(i + 1)*width + j - 1];

			int gxCh2 = abs(com1 + com2 + (smooth_a[i*width + j + 1] - smooth_a[i*width + j - 1]));
			int gyCh2 = abs(com1 - com2 + (smooth_a[(i + 1)*width + j] - smooth_a[(i - 1)*width + j]));
			int ch2Grad = gxCh2 + gyCh2;

			// Gradient for channel3
			com1 = smooth_b[(i + 1)*width + j + 1] - smooth_b[(i - 1)*width + j - 1];
			com2 = smooth_b[(i - 1)*width + j + 1] - smooth_b[(i + 1)*width + j - 1];

			int gxCh3 = abs(com1 + com2 + (smooth_b[i*width + j + 1] - smooth_b[i*width + j - 1]));
			int gyCh3 = abs(com1 - com2 + (smooth_b[(i + 1)*width + j] - smooth_b[(i - 1)*width + j]));
			int ch3Grad = gxCh3 + gyCh3;

			// Take average
			int grad = (ch1Grad + ch2Grad + ch3Grad + 2) / 3;

			gradImg[i*width + j] = grad;
			grads[grad]++;
		} //end-for
	} //end-for

	Mat gradImage = Mat(height, width, CV_16SC1, gradImg);
	imwrite("newGrad.pgm", gradImage);

	// Compute probability function H
	int size = (width - 2)*(height - 2);
	//  size -= grads[0];
	
	for (int i = maxGradValue - 1; i>0; i--) 
		grads[i - 1] += grads[i];
	
	for (int i = 0; i<maxGradValue; i++) 
		H[i] = (double)grads[i] / ((double)size);

	// Compute np: # of segment pieces
	np = 0;
	for (int i = 0; i<segments.size(); i++) {
		int len = (int)segments[i].size();
		np += (len*(len - 1)) / 2;
	} //end-for

	// Validate segments
	for (int i = 0; i< segments.size(); i++) {
		testSegment(i, 0, (int)segments[i].size() - 1);
	} //end-for

	// clear space
	delete[] H;
	delete[] grads;
}